

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdD3D56TexFormat::emulate_mthd(MthdD3D56TexFormat *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = 0xfffff7a6;
  if ((uVar2 & 0x700) == 0x100 && (this->super_SingleMthdTest).super_MthdTest.cls == 0x54) {
    uVar3 = 0xfffff0a6;
  }
  uVar3 = uVar3 & uVar2;
  uVar2 = this->which;
  if ((uVar2 & 1) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     5);
    *pbVar1 = *pbVar1 | 0x80;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[0] = uVar3;
  }
  if ((uVar2 & 2) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 0x20;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[1] = uVar3;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = val & 0xfffff7a6;
		if (cls == 0x54 && extr(val, 8, 3) == 1)
			insrt(rval, 8, 3, 0);
		if (which & 1) {
			insrt(exp.valid[1], 15, 1, 1);
			exp.d3d56_tex_format[0] = rval;
		}
		if (which & 2) {
			insrt(exp.valid[1], 21, 1, 1);
			exp.d3d56_tex_format[1] = rval;
		}
	}